

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::Version::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_001eb074:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_001eb008:
    protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,arena);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0xf) == 0) goto LAB_001eb034;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      this = (MessageLite *)&to_msg[1]._internal_metadata_;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_001eb074;
      goto LAB_001eb008;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    *(undefined4 *)&to_msg[2]._vptr_MessageLite = *(undefined4 *)&from_msg[2]._vptr_MessageLite;
  }
  if ((unaff_EBP & 4) != 0) {
    *(undefined4 *)((long)&to_msg[2]._vptr_MessageLite + 4) =
         *(undefined4 *)((long)&from_msg[2]._vptr_MessageLite + 4);
  }
  if ((unaff_EBP & 8) != 0) {
    *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
  }
LAB_001eb034:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void Version::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Version*>(&to_msg);
  auto& from = static_cast<const Version&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.Version)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_suffix(from._internal_suffix());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.major_ = from._impl_.major_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.minor_ = from._impl_.minor_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.patch_ = from._impl_.patch_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}